

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::PoolingLayerParams::Clear(PoolingLayerParams *this)

{
  PoolingLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::Clear(&this->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::Clear(&this->stride_);
  memset(&this->type_,0,6);
  clear_PoolingPaddingType(this);
  return;
}

Assistant:

void PoolingLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.PoolingLayerParams)
  kernelsize_.Clear();
  stride_.Clear();
  ::memset(&type_, 0, reinterpret_cast<char*>(&globalpooling_) -
    reinterpret_cast<char*>(&type_) + sizeof(globalpooling_));
  clear_PoolingPaddingType();
}